

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

uint64_t uv_metrics_idle_time(uv_loop_t *loop)

{
  void *pvVar1;
  long lVar2;
  uint64_t uVar3;
  uint64_t local_28;
  uint64_t idle_time;
  uint64_t entry_time;
  uv__loop_metrics_t *loop_metrics;
  uv_loop_t *loop_local;
  
  pvVar1 = loop->internal_fields;
  uv_mutex_lock((uv_mutex_t *)((long)pvVar1 + 0x18));
  local_28 = *(uint64_t *)((long)pvVar1 + 0x10);
  lVar2 = *(long *)((long)pvVar1 + 8);
  uv_mutex_unlock((uv_mutex_t *)((long)pvVar1 + 0x18));
  if (lVar2 != 0) {
    uVar3 = uv_hrtime();
    local_28 = (uVar3 - lVar2) + local_28;
  }
  return local_28;
}

Assistant:

uint64_t uv_metrics_idle_time(uv_loop_t* loop) {
  uv__loop_metrics_t* loop_metrics;
  uint64_t entry_time;
  uint64_t idle_time;

  loop_metrics = uv__get_loop_metrics(loop);
  uv_mutex_lock(&loop_metrics->lock);
  idle_time = loop_metrics->provider_idle_time;
  entry_time = loop_metrics->provider_entry_time;
  uv_mutex_unlock(&loop_metrics->lock);

  if (entry_time > 0)
    idle_time += uv_hrtime() - entry_time;
  return idle_time;
}